

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O2

ostream * testing::operator<<(ostream *os,TestPartResult *result)

{
  Type TVar1;
  ostream *poVar2;
  char *pcVar3;
  
  pcVar3 = (char *)(result->file_name_)._M_string_length;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (result->file_name_)._M_dataplus._M_p;
  }
  poVar2 = std::operator<<(os,pcVar3);
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,result->line_number_);
  poVar2 = std::operator<<(poVar2,": ");
  TVar1 = result->type_;
  if (TVar1 == kSuccess) {
    pcVar3 = "Success";
  }
  else if (TVar1 == kSkip) {
    pcVar3 = "Skipped";
  }
  else {
    pcVar3 = "Non-fatal failure";
    if (TVar1 == kFatalFailure) {
      pcVar3 = "Fatal failure";
    }
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,":\n");
  poVar2 = std::operator<<(poVar2,(result->message_)._M_dataplus._M_p);
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TestPartResult& result) {
  return os << result.file_name() << ":" << result.line_number() << ": "
            << (result.type() == TestPartResult::kSuccess
                    ? "Success"
                    : result.type() == TestPartResult::kSkip
                          ? "Skipped"
                          : result.type() == TestPartResult::kFatalFailure
                                ? "Fatal failure"
                                : "Non-fatal failure")
            << ":\n"
            << result.message() << std::endl;
}